

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

void __thiscall ON_LinetypeSegment::Dump(ON_LinetypeSegment *this,ON_TextLog *dump)

{
  eSegType eVar1;
  ON_TextLog *dump_local;
  ON_LinetypeSegment *this_local;
  
  eVar1 = this->m_seg_type;
  if (eVar1 != Unset) {
    if (eVar1 == stLine) {
      ON_TextLog::Print(dump,"Segment type = Line: %g\n",this->m_length);
    }
    else if (eVar1 == stSpace) {
      ON_TextLog::Print(dump,"Segment type = Space: %g\n",this->m_length);
    }
  }
  return;
}

Assistant:

void ON_LinetypeSegment::Dump( ON_TextLog& dump) const
{
  switch( m_seg_type)
  {
  case ON_LinetypeSegment::eSegType::stLine:
    dump.Print( "Segment type = Line: %g\n", m_length);
    break;
  case ON_LinetypeSegment::eSegType::stSpace:
    dump.Print( "Segment type = Space: %g\n", m_length);
    break;
  case ON_LinetypeSegment::eSegType::Unset:
    break;
  }
}